

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

void __thiscall duckdb::LikeMatcher::~LikeMatcher(LikeMatcher *this)

{
  ~LikeMatcher(this);
  operator_delete(this);
  return;
}

Assistant:

LikeMatcher(string like_pattern_p, vector<LikeSegment> segments, bool has_start_percentage, bool has_end_percentage)
	    : like_pattern(std::move(like_pattern_p)), segments(std::move(segments)),
	      has_start_percentage(has_start_percentage), has_end_percentage(has_end_percentage) {
	}